

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrl_params_translate.c
# Opt level: O0

int fix_hkdf_mode(state state,translation_st *translation,translation_ctx_st *ctx)

{
  int iVar1;
  size_t sVar2;
  long in_RDX;
  int in_EDI;
  size_t i_1;
  size_t i;
  int ret;
  translation_ctx_st *in_stack_00000190;
  translation_st *in_stack_00000198;
  state in_stack_000001a0;
  translation_ctx_st *in_stack_ffffffffffffffd0;
  translation_st *in_stack_ffffffffffffffd8;
  ulong uVar3;
  state in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = default_check(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
  if (0 < local_4) {
    if (((*(int *)(in_RDX + 8) == 2) && (in_EDI == 1)) ||
       ((*(int *)(in_RDX + 8) == 1 && (in_EDI == 8)))) {
      for (uVar3 = 0;
          (uVar3 < 3 && (*(uint *)(in_RDX + 0x1c) != fix_hkdf_mode::str_value_map[uVar3].id));
          uVar3 = uVar3 + 1) {
      }
      if (uVar3 == 3) {
        return 0;
      }
      *(void **)(in_RDX + 0x20) = fix_hkdf_mode::str_value_map[uVar3].ptr;
      sVar2 = strlen(*(char **)(in_RDX + 0x20));
      *(int *)(in_RDX + 0x1c) = (int)sVar2;
    }
    local_4 = default_fixup_args(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
    if (0 < local_4) {
      if (((*(int *)(in_RDX + 8) == 2) && (in_EDI == 7)) ||
         ((*(int *)(in_RDX + 8) == 1 && (in_EDI == 2)))) {
        uVar3 = 0;
        while ((uVar3 < 3 &&
               (iVar1 = strcmp(*(char **)(in_RDX + 0x20),
                               (char *)fix_hkdf_mode::str_value_map[uVar3].ptr), iVar1 != 0))) {
          uVar3 = uVar3 + 1;
        }
        if (uVar3 == 3) {
          return 0;
        }
        if (in_EDI != 2) {
          *(uint *)(in_RDX + 0x1c) = fix_hkdf_mode::str_value_map[uVar3].id;
        }
        *(undefined8 *)(in_RDX + 0x20) = 0;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int fix_hkdf_mode(enum state state,
                         const struct translation_st *translation,
                         struct translation_ctx_st *ctx)
{
    static const OSSL_ITEM str_value_map[] = {
        { EVP_KDF_HKDF_MODE_EXTRACT_AND_EXPAND, "EXTRACT_AND_EXPAND" },
        { EVP_KDF_HKDF_MODE_EXTRACT_ONLY,       "EXTRACT_ONLY"       },
        { EVP_KDF_HKDF_MODE_EXPAND_ONLY,        "EXPAND_ONLY"        }
    };
    int ret;

    if ((ret = default_check(state, translation, ctx)) <= 0)
        return ret;

    if ((ctx->action_type == SET && state == PRE_CTRL_TO_PARAMS)
        || (ctx->action_type == GET && state == POST_PARAMS_TO_CTRL)) {
        size_t i;

        for (i = 0; i < OSSL_NELEM(str_value_map); i++) {
            if (ctx->p1 == (int)str_value_map[i].id)
                break;
        }
        if (i == OSSL_NELEM(str_value_map))
            return 0;
        ctx->p2 = str_value_map[i].ptr;
        ctx->p1 = strlen(ctx->p2);
    }

    if ((ret = default_fixup_args(state, translation, ctx)) <= 0)
        return ret;

    if ((ctx->action_type == SET && state == PRE_PARAMS_TO_CTRL)
        || (ctx->action_type == GET && state == POST_CTRL_TO_PARAMS)) {
        size_t i;

        for (i = 0; i < OSSL_NELEM(str_value_map); i++) {
            if (strcmp(ctx->p2, str_value_map[i].ptr) == 0)
                break;
        }
        if (i == OSSL_NELEM(str_value_map))
            return 0;
        if (state == POST_CTRL_TO_PARAMS)
            ret = str_value_map[i].id;
        else
            ctx->p1 = str_value_map[i].id;
        ctx->p2 = NULL;
    }

    return 1;
}